

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O2

void expr_free(expr_t *expr)

{
  list_node_t *plVar1;
  
  if (expr->param != (thanm_param_t *)0x0) {
    thanm_param_free(expr->param);
  }
  plVar1 = (list_node_t *)&expr->children;
  while (plVar1 = plVar1->next, plVar1 != (list_node_t *)0x0) {
    expr_free((expr_t *)plVar1->data);
  }
  list_free_nodes(&expr->children);
  free(expr);
  return;
}

Assistant:

void
expr_free(
    expr_t* expr
) {
    if (expr->param)
        thanm_param_free(expr->param);

    expr_t* child;
    list_for_each(&expr->children, child)
        expr_free(child);

    list_free_nodes(&expr->children);
    free(expr);
}